

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void releaseMonitor(_GLFWwindow *window)

{
  if (window->monitor->window == window) {
    _glfwInputMonitorWindowChange(window->monitor,(_GLFWwindow *)0x0);
    _glfwRestoreVideoModeX11(window->monitor);
    _glfw.x11.saver.count = _glfw.x11.saver.count + -1;
    if (_glfw.x11.saver.count == 0) {
      XSetScreenSaver(_glfw.x11.display,_glfw.x11.saver.timeout,_glfw.x11.saver.interval,
                      _glfw.x11.saver.blanking,_glfw.x11.saver.exposure);
      return;
    }
  }
  return;
}

Assistant:

static void releaseMonitor(_GLFWwindow* window)
{
    if (window->monitor->window != window)
        return;

    _glfwInputMonitorWindowChange(window->monitor, NULL);
    _glfwRestoreVideoModeX11(window->monitor);

    _glfw.x11.saver.count--;

    if (_glfw.x11.saver.count == 0)
    {
        // Restore old screen saver settings
        XSetScreenSaver(_glfw.x11.display,
                        _glfw.x11.saver.timeout,
                        _glfw.x11.saver.interval,
                        _glfw.x11.saver.blanking,
                        _glfw.x11.saver.exposure);
    }
}